

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void * do_rallocx(void *ptr,size_t size,int flags,_Bool is_realloc)

{
  ulong oldsize;
  void **ppvVar1;
  uint64_t uVar2;
  long lVar3;
  bool bVar4;
  _Bool _Var5;
  tcaches_t *ptVar6;
  ulong uVar7;
  int *piVar8;
  void *__dest;
  tsd_t *tsd;
  arena_t *arena;
  anon_union_8_2_150e8edc_for_tcaches_s_0 key;
  size_t usize;
  ulong alignment;
  rtree_t *prVar9;
  uint uVar10;
  ulong uVar11;
  uintptr_t key_00;
  _Bool zero;
  cache_bin_t *cache_bin;
  size_t excess_len;
  size_t sVar13;
  long *in_FS_OFFSET;
  rtree_metadata_t rVar14;
  anon_union_8_2_150e8edc_for_tcaches_s_0 local_210;
  hook_ralloc_args_t hook_args;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  byte bVar12;
  
  key._4_4_ = 0;
  key._0_4_ = flags;
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  _Var5 = duckdb_je_opt_zero;
  bVar12 = (byte)((flags & 0x40U) >> 6);
  zero = (_Bool)(bVar12 | duckdb_je_opt_zero);
  if ((uint)flags < 0x100000) {
LAB_00e4c655:
    arena = (arena_t *)0x0;
  }
  else {
    uVar10 = ((uint)flags >> 0x14) - 1;
    arena = arena_get((tsdn_t *)tsd,uVar10,true);
    if (arena == (arena_t *)0x0) {
      if (duckdb_je_narenas_auto <= uVar10) goto LAB_00e4c7e0;
      goto LAB_00e4c655;
    }
  }
  ptVar6 = duckdb_je_tcaches;
  uVar10 = flags & 0xfff00;
  if (uVar10 == 0) {
LAB_00e4c66b:
    key.tcache = (tcache_t *)0x0;
    local_210.tcache = (tcache_t *)0x0;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
      key.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      local_210.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
LAB_00e4c680:
    prVar9 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    bVar4 = false;
  }
  else {
    if ((uVar10 == 0x100) || (uVar10 >> 8 == 1)) {
      local_210.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar10 == 0) goto LAB_00e4c66b;
      uVar10 = (uVar10 >> 8) - 2;
      local_210 = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[uVar10].field_0.tcache;
      if (local_210 == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (local_210 == (tcache_t *)0x1) {
        local_210.tcache = duckdb_je_tcache_create_explicit(tsd);
        ptVar6[uVar10].field_0.tcache = (tcache_t *)local_210;
        key.next = ptVar6;
      }
    }
    if (tsd != (tsd_t *)0x0) goto LAB_00e4c680;
    prVar9 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar9);
    bVar4 = true;
  }
  alignment = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  rVar14 = rtree_metadata_read((tsdn_t *)tsd,prVar9,(rtree_ctx_t *)ptr,(uintptr_t)key);
  oldsize = duckdb_je_sz_index2size_tab[rVar14.szind];
  if (alignment == 0) {
    if (size < 0x1001) {
      sVar13 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_00e4c7e0;
      uVar7 = size * 2 - 1;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar7 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      sVar13 = ~uVar7 + size & uVar7;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar7 = -alignment & (size - 1) + alignment;
      if (uVar7 < 0x1001) {
        sVar13 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar7 + 7 >> 3]];
      }
      else {
        uVar11 = uVar7 * 2 - 1;
        lVar3 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar11 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
        sVar13 = ~uVar11 + uVar7 & uVar11;
      }
      uVar7 = 0x4000;
      if (sVar13 < 0x4000) goto LAB_00e4c7c9;
    }
    else {
      if (0x7000000000000000 < alignment) goto LAB_00e4c7e0;
      uVar7 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar7 = size * 2 - 1;
          lVar3 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar7 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
          uVar7 = ~uVar7 + size & uVar7;
        }
        else {
          uVar7 = 0;
        }
        if (uVar7 < size) goto LAB_00e4c7e0;
      }
    }
    sVar13 = 0;
    if (uVar7 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar7) -
                 0x1000) {
      sVar13 = uVar7;
    }
  }
LAB_00e4c7c9:
  if (sVar13 + 0x8fffffffffffffff < 0x9000000000000000) goto LAB_00e4c7e0;
  hook_args.args[3] = 0;
  hook_args.args[2] = (uintptr_t)flags;
  hook_args.is_realloc = is_realloc;
  hook_args.args[0] = (uintptr_t)ptr;
  hook_args.args[1] = size;
  if ((alignment == 0) || ((alignment - 1 & (ulong)ptr) == 0)) {
    __dest = duckdb_je_arena_ralloc
                       ((tsdn_t *)tsd,arena,ptr,oldsize,size,alignment,zero,sVar13 < 0x3801,
                        local_210.tcache,&hook_args);
    if (__dest == (void *)0x0) goto LAB_00e4c7e0;
    goto LAB_00e4ca5c;
  }
  if (alignment < 0x1001 && size < 0x3801) {
    uVar7 = -alignment & (alignment - 1) + size;
    if (uVar7 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar7 + 7 >> 3]];
    }
    else {
      uVar11 = uVar7 * 2 - 1;
      lVar3 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
      usize = ~uVar11 + uVar7 & uVar11;
    }
    uVar7 = 0x4000;
    if (0x3fff < usize) goto LAB_00e4c935;
  }
  else {
    uVar7 = 0x4000;
    if (0x4000 < size) {
      if (size < 0x7000000000000001) {
        uVar7 = size * 2 - 1;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar7 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
        uVar7 = ~uVar7 + size & uVar7;
      }
      else {
        uVar7 = 0;
      }
      if (uVar7 < size) goto LAB_00e4c7e0;
    }
LAB_00e4c935:
    usize = 0;
    if (uVar7 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar7) -
                 0x1000) {
      usize = uVar7;
    }
  }
  if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
LAB_00e4c7e0:
    if (is_realloc) {
      piVar8 = __errno_location();
      *piVar8 = 0xc;
    }
    return (void *)0x0;
  }
  key_00 = (uintptr_t)zero;
  __dest = duckdb_je_arena_palloc
                     ((tsdn_t *)tsd,arena,usize,alignment,zero,sVar13 < 0x3801,local_210.tcache);
  if (__dest == (void *)0x0) goto LAB_00e4c7e0;
  if (oldsize <= size) {
    size = oldsize;
  }
  switchD_00917c1c::default(__dest,ptr,size);
  duckdb_je_hook_invoke_alloc
            (hook_args.is_realloc ^ hook_alloc_rallocx,__dest,(uintptr_t)__dest,hook_args.args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args.is_realloc,ptr,hook_args.args);
  if (local_210.tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,oldsize);
    goto LAB_00e4ca5c;
  }
  if (oldsize < 0x1001) {
    uVar10 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
  }
  else {
    uVar10 = sz_size2index_compute(oldsize);
  }
  if (uVar10 < 0x24) {
    cache_bin = (local_210.tcache)->bins + uVar10;
    ppvVar1 = cache_bin->stack_head;
    if ((local_210.tcache)->bins[uVar10].low_bits_full != (uint16_t)ppvVar1) {
      cache_bin->stack_head = ppvVar1 + -1;
      ppvVar1[-1] = ptr;
      goto LAB_00e4ca5c;
    }
    if (ppvVar1 == (void **)&duckdb_je_disabled_bin) {
      duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      goto LAB_00e4ca5c;
    }
    duckdb_je_tcache_bin_flush_small
              (tsd,local_210.tcache,cache_bin,uVar10,
               (uint)((local_210.tcache)->bins[uVar10].bin_info.ncached_max >>
                     ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_00e4cd5c:
    ppvVar1 = cache_bin->stack_head;
    if (cache_bin->low_bits_full != (uint16_t)ppvVar1) {
      cache_bin->stack_head = ppvVar1 + -1;
      ppvVar1[-1] = ptr;
    }
  }
  else {
    if (uVar10 < (local_210.tcache)->tcache_slow->tcache_nbins) {
      ppvVar1 = (local_210.tcache)->bins[uVar10].stack_head;
      if (ppvVar1 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = (local_210.tcache)->bins + uVar10;
        if ((local_210.tcache)->bins[uVar10].low_bits_full != (uint16_t)ppvVar1) {
          cache_bin->stack_head = ppvVar1 + -1;
          ppvVar1[-1] = ptr;
          goto LAB_00e4ca5c;
        }
        duckdb_je_tcache_bin_flush_large
                  (tsd,local_210.tcache,cache_bin,uVar10,
                   (uint)((local_210.tcache)->bins[uVar10].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_00e4cd5c;
      }
    }
    if (bVar4) {
      prVar9 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar9);
    }
    else {
      prVar9 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,prVar9,(rtree_ctx_t *)ptr,key_00);
    duckdb_je_large_dalloc((tsdn_t *)tsd,local_1c8.edata);
  }
LAB_00e4ca5c:
  rtree_ctx_fallback.cache[0].leafkey._0_1_ = 1;
  rtree_ctx_fallback.cache[0].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  rtree_ctx_fallback.cache[1].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
  rtree_ctx_fallback.cache[1].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
  rtree_ctx_fallback.cache[2].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
  uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar2 + sVar13;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event - uVar2
      <= sVar13) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
  }
  rtree_ctx_fallback.cache[0].leafkey._0_1_ = 0;
  rtree_ctx_fallback.cache[0].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  rtree_ctx_fallback.cache[1].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  rtree_ctx_fallback.cache[1].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  rtree_ctx_fallback.cache[2].leafkey =
       (uintptr_t)
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  uVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar2 + oldsize;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar2 <= oldsize) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
  }
  if (duckdb_je_opt_junk_alloc != true) {
    return __dest;
  }
  if ((sVar13 < oldsize || sVar13 - oldsize == 0) || (bVar12 != 0 || (_Var5 & 1U) != 0)) {
    return __dest;
  }
  switchD_004a0b15::default((void *)(oldsize + (long)__dest),0xa5,sVar13 - oldsize);
  return __dest;
}

Assistant:

static void *
do_rallocx(void *ptr, size_t size, int flags, bool is_realloc) {
	void *p;
	tsd_t *tsd;
	size_t usize;
	size_t old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	arena_t *arena;

	assert(ptr != NULL);
	assert(size != 0);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	unsigned arena_ind = mallocx_arena_get(flags);
	if (arena_get_from_ind(tsd, arena_ind, &arena)) {
		goto label_oom;
	}

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind,
	    /* slow */ true, /* is_alloc */ true);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	if (aligned_usize_get(size, alignment, &usize, NULL, false)) {
		goto label_oom;
	}

	hook_ralloc_args_t hook_args = {is_realloc, {(uintptr_t)ptr, size,
		flags, 0}};
	if (config_prof && opt_prof) {
		p = irallocx_prof(tsd, ptr, old_usize, size, alignment, usize,
		    zero, tcache, arena, &alloc_ctx, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
	} else {
		p = iralloct(tsd_tsdn(tsd), ptr, old_usize, size, alignment,
		    usize, zero, tcache, arena, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
		assert(usize == isalloc(tsd_tsdn(tsd), p));
	}
	assert(alignment == 0 || ((uintptr_t)p & (alignment - 1)) == ZU(0));
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	UTRACE(ptr, size, p);
	check_entry_exit_locking(tsd_tsdn(tsd));

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize
	    && !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)p + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}

	return p;
label_oom:
	if (is_realloc) {
		set_errno(ENOMEM);
	}
	if (config_xmalloc && unlikely(opt_xmalloc)) {
		malloc_write("<jemalloc>: Error in rallocx(): out of memory\n");
		abort();
	}
	UTRACE(ptr, size, 0);
	check_entry_exit_locking(tsd_tsdn(tsd));

	return NULL;
}